

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_image::get_block_endpoints
          (dxt_image *this,uint block_x,uint block_y,uint element_index,uint *packed_low_endpoint,
          uint *packed_high_endpoint)

{
  bool bVar1;
  uint16 uVar2;
  uint uVar3;
  etc1_block *this_00;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  dxt_image *in_RDI;
  uint *in_R8;
  uint *in_R9;
  dxt5_block *block5;
  dxt1_block *block1;
  etc1_block *src_block;
  element *block;
  undefined8 in_stack_ffffffffffffffb8;
  etc1_block *in_stack_ffffffffffffffc0;
  
  this_00 = (etc1_block *)get_element(in_RDI,in_ESI,in_EDX,in_ECX);
  switch(in_RDI->m_element_type[in_ECX]) {
  case cColorDXT1:
    uVar3 = dxt1_block::get_low_color((dxt1_block *)this_00);
    *in_R8 = uVar3;
    uVar3 = dxt1_block::get_high_color((dxt1_block *)this_00);
    *in_R9 = uVar3;
    break;
  case cAlphaDXT3:
    *in_R8 = 0;
    *in_R9 = 0xff;
    break;
  case cAlphaDXT5:
    uVar3 = dxt5_block::get_low_alpha((dxt5_block *)this_00);
    *in_R8 = uVar3;
    uVar3 = dxt5_block::get_high_alpha((dxt5_block *)this_00);
    *in_R9 = uVar3;
    break;
  case cColorETC1:
    bVar1 = etc1_block::get_diff_bit(this_00);
    if (bVar1) {
      uVar2 = etc1_block::get_base5_color(in_stack_ffffffffffffffc0);
      *in_R8 = (uint)uVar2;
      uVar2 = etc1_block::get_delta3_color(in_stack_ffffffffffffffc0);
      *in_R9 = (uint)uVar2;
    }
    else {
      uVar3 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      uVar2 = etc1_block::get_base4_color(in_stack_ffffffffffffffc0,uVar3);
      *in_R8 = (uint)uVar2;
      uVar2 = etc1_block::get_base4_color(in_stack_ffffffffffffffc0,uVar3);
      *in_R9 = (uint)uVar2;
    }
  }
  return;
}

Assistant:

void dxt_image::get_block_endpoints(uint block_x, uint block_y, uint element_index, uint& packed_low_endpoint, uint& packed_high_endpoint) const {
  const element& block = get_element(block_x, block_y, element_index);

  switch (m_element_type[element_index]) {
    case cColorETC1: {
      const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
      if (src_block.get_diff_bit()) {
        packed_low_endpoint = src_block.get_base5_color();
        packed_high_endpoint = src_block.get_delta3_color();
      } else {
        packed_low_endpoint = src_block.get_base4_color(0);
        packed_high_endpoint = src_block.get_base4_color(1);
      }

      break;
    }
    case cColorDXT1: {
      const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);

      packed_low_endpoint = block1.get_low_color();
      packed_high_endpoint = block1.get_high_color();

      break;
    }
    case cAlphaDXT5: {
      const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);

      packed_low_endpoint = block5.get_low_alpha();
      packed_high_endpoint = block5.get_high_alpha();

      break;
    }
    case cAlphaDXT3: {
      packed_low_endpoint = 0;
      packed_high_endpoint = 255;

      break;
    }
    default:
      break;
  }
}